

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldConvertorsTests::TestutcTimeOnlyConvertFromMicro::RunImpl
          (TestutcTimeOnlyConvertFromMicro *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int local_48;
  int local_44;
  TestDetails local_40;
  UtcTimeOnly result;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"12:05:06.555555",(allocator<char> *)&local_48);
  FIX::UtcTimeOnlyConvertor::convert(&result,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_48 = 0xc;
  local_44 = (int)(result.super_DateTime.m_time / 3600000000000);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x1a3);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_48,&local_44,&local_40);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_48 = 5;
  local_44 = (int)((long)((ulong)(uint)((int)(result.super_DateTime.m_time / 60000000000) >> 0x1f)
                          << 0x20 | result.super_DateTime.m_time / 60000000000 & 0xffffffffU) % 0x3c
                  );
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x1a4);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_48,&local_44,&local_40);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_48 = 6;
  local_44 = (int)((result.super_DateTime.m_time / 1000000000) % 0x3c);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x1a5);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_48,&local_44,&local_40);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_48 = 0x87a23;
  local_44 = (int)(((ulong)result.super_DateTime.m_time % 1000000000) / 1000);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x1a6);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_48,&local_44,&local_40);
  return;
}

Assistant:

TEST(utcTimeOnlyConvertFromMicro)
{
  UtcTimeOnly result = UtcTimeOnlyConvertor::convert
                       ( std::string( "12:05:06.555555" ) );
  CHECK_EQUAL( 12, result.getHour() );
  CHECK_EQUAL( 5, result.getMinute() );
  CHECK_EQUAL( 6, result.getSecond() );
  CHECK_EQUAL( 555555, result.getFraction(6) );
}